

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O2

void __thiscall
bssl::MRUQueue<bssl::DTLSRecordNumber,_32UL>::PushBack
          (MRUQueue<bssl::DTLSRecordNumber,_32UL> *this,DTLSRecordNumber t)

{
  DTLSRecordNumber *pDVar1;
  
  if (0x1f < (this->storage_).size_) {
    pDVar1 = operator[](this,0);
    pDVar1->combined_ = t.combined_;
    this->start_ = this->start_ + 1 & 0x1f;
    return;
  }
  if (this->start_ == '\0') {
    InplaceVector<bssl::DTLSRecordNumber,_32UL>::PushBack(&this->storage_,t);
    return;
  }
  __assert_fail("start_ == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/internal.h"
                ,100,
                "void bssl::MRUQueue<bssl::DTLSRecordNumber, 32>::PushBack(T) [T = bssl::DTLSRecordNumber, N = 32]"
               );
}

Assistant:

void PushBack(T t) {
    if (storage_.size() < N) {
      assert(start_ == 0);
      storage_.PushBack(std::move(t));
    } else {
      (*this)[0] = std::move(t);
      start_ = (start_ + 1) % N;
    }
  }